

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_> *
__thiscall
CMU462::StaticScene::SphereObject::get_primitives
          (vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
           *__return_storage_ptr__,SphereObject *this)

{
  Sphere *this_00;
  Sphere *local_28;
  undefined1 local_19;
  SphereObject *local_18;
  SphereObject *this_local;
  vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  *primitives;
  
  local_19 = 0;
  local_18 = this;
  this_local = (SphereObject *)__return_storage_ptr__;
  std::vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>::
  vector(__return_storage_ptr__);
  this_00 = (Sphere *)operator_new(0x38);
  Sphere::Sphere(this_00,this,&this->o,this->r);
  local_28 = this_00;
  std::vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>::
  push_back(__return_storage_ptr__,(value_type *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Primitive*> SphereObject::get_primitives() const {
  std::vector<Primitive*> primitives;
  primitives.push_back(new Sphere(this,o,r));
  return primitives;
}